

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SizeT ARMT_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  ulong in_RAX;
  uint uVar1;
  
  if (3 < size) {
    in_RAX = 0;
    do {
      if (((data[in_RAX + 1] & 0xf8) == 0xf0) && ((~(uint)data[in_RAX + 3] & 0xf8) == 0)) {
        uVar1 = (((uint)data[in_RAX + 2] |
                 (data[in_RAX + 3] & 7) << 8 |
                 (uint)data[in_RAX] << 0xb | (data[in_RAX + 1] & 7) << 0x13) * 2 - (int)in_RAX) - 4;
        data[in_RAX + 1] = (byte)(uVar1 >> 0x14) & 7 | 0xf0;
        data[in_RAX] = (Byte)(uVar1 >> 0xc);
        data[in_RAX + 3] = (byte)(uVar1 >> 9) | 0xf8;
        data[in_RAX + 2] = (Byte)(uVar1 >> 1);
        in_RAX = in_RAX + 2;
      }
      in_RAX = in_RAX + 2;
    } while (in_RAX <= size - 4);
  }
  return in_RAX;
}

Assistant:

static SizeT ARMT_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 4)
    return 0;
  size -= 4;
  ip += 4;
  for (i = 0; i <= size; i += 2)
  {
    if ((data[i + 1] & 0xF8) == 0xF0 &&
        (data[i + 3] & 0xF8) == 0xF8)
    {
      UInt32 dest;
      UInt32 src =
        (((UInt32)data[i + 1] & 0x7) << 19) |
        ((UInt32)data[i + 0] << 11) |
        (((UInt32)data[i + 3] & 0x7) << 8) |
        (data[i + 2]);
      
      src <<= 1;
      if (encoding)
        dest = ip + (UInt32)i + src;
      else
        dest = src - (ip + (UInt32)i);
      dest >>= 1;
      
      data[i + 1] = (Byte)(0xF0 | ((dest >> 19) & 0x7));
      data[i + 0] = (Byte)(dest >> 11);
      data[i + 3] = (Byte)(0xF8 | ((dest >> 8) & 0x7));
      data[i + 2] = (Byte)dest;
      i += 2;
    }
  }
  return i;
}